

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_mpi.c
# Opt level: O2

int Env_nproc_y(Env *env)

{
  return 1;
}

Assistant:

int Env_nproc_y( const Env* env )
{
  Assert( Env_mpi_are_values_set_( env ) );
  int result = 1;
#ifdef USE_MPI
  result = env->nproc_y_;
#endif
  Assert( result > 0 );
  return result;
}